

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathNative.cpp
# Opt level: O2

void chatra::emb::math::math_abs(Ct *ct)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  undefined4 extraout_var_01;
  IllegalArgumentException *this;
  long lVar4;
  undefined4 uVar5;
  
  iVar2 = (*ct->_vptr_NativeCallContext[10])(ct,0);
  cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))
                    ((long *)CONCAT44(extraout_var,iVar2));
  iVar2 = (*ct->_vptr_NativeCallContext[10])(ct,0);
  lVar4 = *(long *)CONCAT44(extraout_var_00,iVar2);
  if (cVar1 != '\0') {
    lVar3 = (**(code **)(lVar4 + 0x58))();
    lVar4 = -lVar3;
    if (0 < lVar3) {
      lVar4 = lVar3;
    }
    (*ct->_vptr_NativeCallContext[0xe])(ct,lVar4);
    return;
  }
  cVar1 = (**(code **)(lVar4 + 0x28))((long *)CONCAT44(extraout_var_00,iVar2));
  if (cVar1 != '\0') {
    iVar2 = (*ct->_vptr_NativeCallContext[10])(ct,0);
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x60))
                      ((long *)CONCAT44(extraout_var_01,iVar2));
    (*ct->_vptr_NativeCallContext[0xf])(uVar5,ct);
    return;
  }
  this = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
  IllegalArgumentException::IllegalArgumentException(this,"passing argument has non-numeric value");
  __cxa_throw(this,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
}

Assistant:

static void math_abs(Ct& ct) {
	if (ct[0].isInt())
		ct.setInt(std::abs(ct[0].getInt()));
	else if (ct[0].isFloat())
		ct.setFloat(std::abs(ct[0].getFloat()));
	else
		throw IllegalArgumentException("passing argument has non-numeric value");
}